

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Store::Collect(Store *this)

{
  bool bVar1;
  Index IVar2;
  Ref *pRVar3;
  reference ppTVar4;
  reference pvVar5;
  Object **ppOVar6;
  vector<bool,_std::allocator<bool>_> *this_00;
  iterator iVar7;
  _Bit_iterator __first;
  _Bit_iterator __last;
  byte local_d9;
  reference local_c0;
  Index local_b0;
  size_t i_1;
  size_type local_98;
  size_t index;
  Thread *thread;
  iterator __end2;
  iterator __begin2;
  set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  *__range2;
  ulong local_68;
  Index i;
  _Bit_type *local_58;
  uint local_50;
  _Bit_type *local_48;
  uint local_40;
  _Bit_type *local_38;
  uint local_30;
  _Bit_type *local_28;
  uint local_20;
  Index local_18;
  size_t object_count;
  Store *this_local;
  
  object_count = (size_t)this;
  local_18 = FreeList<wabt::interp::Object_*>::size(&this->objects_);
  if ((this->gc_context_).call_depth != 0) {
    __assert_fail("gc_context_.call_depth == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                  ,0xfe,"void wabt::interp::Store::Collect()");
  }
  this_00 = &(this->gc_context_).marks;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,local_18,false);
  iVar7 = std::vector<bool,_std::allocator<bool>_>::begin(this_00);
  local_38 = iVar7.super__Bit_iterator_base._M_p;
  local_30 = iVar7.super__Bit_iterator_base._M_offset;
  local_28 = local_38;
  local_20 = local_30;
  iVar7 = std::vector<bool,_std::allocator<bool>_>::end(this_00);
  local_58 = iVar7.super__Bit_iterator_base._M_p;
  local_50 = iVar7.super__Bit_iterator_base._M_offset;
  i._7_1_ = 0;
  __first.super__Bit_iterator_base._M_offset = local_20;
  __first.super__Bit_iterator_base._M_p = local_28;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar7.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar7.super__Bit_iterator_base._0_12_,8);
  local_48 = local_58;
  local_40 = local_50;
  std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)((long)&i + 7));
  for (local_68 = 0; IVar2 = FreeList<wabt::interp::Ref>::size(&this->roots_), local_68 < IVar2;
      local_68 = local_68 + 1) {
    bVar1 = FreeList<wabt::interp::Ref>::IsUsed(&this->roots_,local_68);
    if (bVar1) {
      pRVar3 = FreeList<wabt::interp::Ref>::Get(&this->roots_,local_68);
      Mark(this,(Ref)pRVar3->index);
    }
  }
  __end2 = std::
           set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
           ::begin(&this->threads_);
  thread = (Thread *)
           std::
           set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
           ::end(&this->threads_);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&thread), bVar1) {
    ppTVar4 = std::_Rb_tree_const_iterator<wabt::interp::Thread_*>::operator*(&__end2);
    index = (size_t)*ppTVar4;
    Thread::Mark((Thread *)index);
    std::_Rb_tree_const_iterator<wabt::interp::Thread_*>::operator++(&__end2);
  }
  while( true ) {
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (&(this->gc_context_).untraced_objects);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((this->gc_context_).call_depth != 0) {
        __assert_fail("gc_context_.call_depth == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                      ,0x11a,"void wabt::interp::Store::Collect()");
      }
      for (local_b0 = 0; local_b0 < local_18; local_b0 = local_b0 + 1) {
        bVar1 = FreeList<wabt::interp::Object_*>::IsUsed(&this->objects_,local_b0);
        local_d9 = 0;
        if (bVar1) {
          local_c0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&(this->gc_context_).marks,local_b0);
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_c0);
          local_d9 = bVar1 ^ 0xff;
        }
        if ((local_d9 & 1) != 0) {
          FreeList<wabt::interp::Object_*>::Delete(&this->objects_,local_b0);
        }
      }
      return;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       (&(this->gc_context_).untraced_objects);
    local_98 = *pvVar5;
    _i_1 = std::vector<bool,_std::allocator<bool>_>::operator[](&(this->gc_context_).marks,local_98)
    ;
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&i_1);
    if (!bVar1) break;
    if ((this->gc_context_).call_depth != 0) {
      __assert_fail("gc_context_.call_depth == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                    ,0x114,"void wabt::interp::Store::Collect()");
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              (&(this->gc_context_).untraced_objects);
    ppOVar6 = FreeList<wabt::interp::Object_*>::Get(&this->objects_,local_98);
    (*(*ppOVar6)->_vptr_Object[2])(*ppOVar6,this);
  }
  __assert_fail("gc_context_.marks[index]",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                ,0x113,"void wabt::interp::Store::Collect()");
}

Assistant:

void Store::Collect() {
  size_t object_count = objects_.size();

  assert(gc_context_.call_depth == 0);

  gc_context_.marks.resize(object_count);
  std::fill(gc_context_.marks.begin(), gc_context_.marks.end(), false);

  // First mark all roots.
  for (RootList::Index i = 0; i < roots_.size(); ++i) {
    if (roots_.IsUsed(i)) {
      Mark(roots_.Get(i));
    }
  }

  for (auto thread : threads_) {
    thread->Mark();
  }

  // This vector is often empty since the default maximum
  // recursion is usually enough to mark all objects.
  while (WABT_UNLIKELY(!gc_context_.untraced_objects.empty())) {
    size_t index = gc_context_.untraced_objects.back();

    assert(gc_context_.marks[index]);
    assert(gc_context_.call_depth == 0);

    gc_context_.untraced_objects.pop_back();
    objects_.Get(index)->Mark(*this);
  }

  assert(gc_context_.call_depth == 0);

  // Delete all unmarked objects.
  for (size_t i = 0; i < object_count; ++i) {
    if (objects_.IsUsed(i) && !gc_context_.marks[i]) {
      objects_.Delete(i);
    }
  }
}